

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cStencilTexturingTests.cpp
# Opt level: O2

GLuint gl4cts::StencilTexturing::Utils::createAndBuildProgram
                 (Context *context,GLchar *cs_code,GLchar *fs_code,GLchar *gs_code,GLchar *tcs_code,
                 GLchar *tes_code,GLchar *vs_code)

{
  ostringstream *poVar1;
  GLchar *code;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  GLuint i;
  GLuint j_1;
  GLuint j_2;
  long lVar5;
  GLuint j;
  long lVar6;
  GLint length;
  GLint status;
  GLuint shader_ids [6];
  string message;
  GLchar *shader_sources [6];
  undefined1 local_1b0 [384];
  
  iVar2 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  shader_ids[4] = 0;
  shader_ids[5] = 0;
  shader_ids[0] = 0;
  shader_ids[1] = 0;
  shader_ids[2] = 0;
  shader_ids[3] = 0;
  shader_sources[0] = cs_code;
  shader_sources[1] = fs_code;
  shader_sources[2] = gs_code;
  shader_sources[3] = tcs_code;
  status = 0;
  shader_sources[4] = tes_code;
  shader_sources[5] = vs_code;
  for (lVar5 = 0; lVar5 != 0x18; lVar5 = lVar5 + 4) {
    code = *(GLchar **)((long)shader_sources + lVar5 * 2);
    if (code != (GLchar *)0x0) {
      GVar3 = createAndCompileShader(context,*(GLenum *)((long)&DAT_016e9520 + lVar5),code);
      *(GLuint *)((long)shader_ids + lVar5) = GVar3;
    }
  }
  lVar5 = 0;
  while( true ) {
    if (lVar5 == 6) {
      GVar3 = (**(code **)(lVar6 + 0x3c8))();
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"CreateProgram",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                      ,0x7f);
      for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
        if (shader_ids[lVar5] != 0) {
          (**(code **)(lVar6 + 0x10))(GVar3);
          dVar4 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar4,"AttachShader",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                          ,0x87);
        }
      }
      (**(code **)(lVar6 + 0xce8))(GVar3);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"LinkProgram",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                      ,0x8d);
      for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
        deleteShader(context,shader_ids[lVar5]);
      }
      (**(code **)(lVar6 + 0x9d8))(GVar3,0x8b82,&status);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"GetProgramiv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                      ,0x97);
      if (status != 1) {
        message._M_dataplus._M_p = (pointer)&message.field_2;
        message._M_string_length = 0;
        message.field_2._M_local_buf[0] = '\0';
        (**(code **)(lVar6 + 0x9d8))(GVar3,0x8b84);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"GetProgramiv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                        ,0xa1);
        std::__cxx11::string::resize((ulong)&message,'\0');
        (**(code **)(lVar6 + 0x988))(GVar3,0,0,message._M_dataplus._M_p);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"GetProgramInfoLog",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                        ,0xa7);
        local_1b0._0_8_ = context->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Program linking failed: ");
        std::operator<<((ostream *)poVar1,(string *)&message);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        deleteProgram(context,GVar3);
        std::__cxx11::string::~string((string *)&message);
        GVar3 = 0;
      }
      return GVar3;
    }
    if ((shader_sources[lVar5] != (GLchar *)0x0) && (shader_ids[lVar5] == 0)) break;
    lVar5 = lVar5 + 1;
  }
  local_1b0._0_8_ = context->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Failed to build program due to compilation problems");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
    deleteShader(context,shader_ids[lVar6]);
  }
  return 0;
}

Assistant:

GLuint Utils::createAndBuildProgram(deqp::Context& context, const GLchar* cs_code, const GLchar* fs_code,
									const GLchar* gs_code, const GLchar* tcs_code, const GLchar* tes_code,
									const GLchar* vs_code)
{
#define N_SHADER_STAGES 6

	const Functions& gl							 = context.getRenderContext().getFunctions();
	GLuint			 id							 = 0;
	GLuint			 shader_ids[N_SHADER_STAGES] = { 0 };

	const GLchar* shader_sources[N_SHADER_STAGES] = { cs_code, fs_code, gs_code, tcs_code, tes_code, vs_code };

	const GLenum shader_types[N_SHADER_STAGES] = { GL_COMPUTE_SHADER,		  GL_FRAGMENT_SHADER,
												   GL_GEOMETRY_SHADER,		  GL_TESS_CONTROL_SHADER,
												   GL_TESS_EVALUATION_SHADER, GL_VERTEX_SHADER };
	GLint status = GL_FALSE;

	/* Compile all shaders */
	try
	{
		for (GLuint i = 0; i < N_SHADER_STAGES; ++i)
		{
			if (0 != shader_sources[i])
			{
				shader_ids[i] = createAndCompileShader(context, shader_types[i], shader_sources[i]);
			}
		}

		/* Check compilation */
		for (GLuint i = 0; i < N_SHADER_STAGES; ++i)
		{
			if ((0 != shader_sources[i]) && (0 == shader_ids[i]))
			{
				context.getTestContext().getLog() << tcu::TestLog::Message
												  << "Failed to build program due to compilation problems"
												  << tcu::TestLog::EndMessage;

				/* Delete shaders */
				for (GLuint j = 0; j < N_SHADER_STAGES; ++j)
				{
					deleteShader(context, shader_ids[j]);
				}

				/* Done */
				return 0;
			}
		}

		/* Create program */
		id = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "CreateProgram");

		/* Attach shaders */
		for (GLuint i = 0; i < N_SHADER_STAGES; ++i)
		{
			if (0 != shader_ids[i])
			{
				gl.attachShader(id, shader_ids[i]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "AttachShader");
			}
		}

		/* Link program */
		gl.linkProgram(id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "LinkProgram");

		/* Clean shaders */
		for (GLuint j = 0; j < N_SHADER_STAGES; ++j)
		{
			deleteShader(context, shader_ids[j]);
		}

		/* Get link status */
		gl.getProgramiv(id, GL_LINK_STATUS, &status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

		/* Log link error */
		if (GL_TRUE != status)
		{
			glw::GLint  length = 0;
			std::string message;

			/* Get error log length */
			gl.getProgramiv(id, GL_INFO_LOG_LENGTH, &length);
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

			message.resize(length, 0);

			/* Get error log */
			gl.getProgramInfoLog(id, length, 0, &message[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramInfoLog");

			context.getTestContext().getLog() << tcu::TestLog::Message << "Program linking failed: " << message
											  << tcu::TestLog::EndMessage;

			/* Clean program */
			deleteProgram(context, id);

			/* Done */
			return 0;
		}
	}
	catch (std::exception& exc)
	{
		/* Delete shaders */
		for (GLuint j = 0; j < N_SHADER_STAGES; ++j)
		{
			deleteShader(context, shader_ids[j]);
		}

		throw exc;
	}

	return id;
}